

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

void __thiscall Iir::BiquadPoleState::BiquadPoleState(BiquadPoleState *this,Biquad *s)

{
  bool bVar1;
  Biquad *in_RSI;
  complex<double> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ComplexPair *extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  char *extraout_XMM0_Qa_03;
  undefined8 uVar2;
  double d_1;
  complex_t c_1;
  double d;
  complex_t c;
  double b2;
  double b1;
  double b0;
  double a2;
  double a1;
  double a0;
  PoleZeroPair *in_stack_fffffffffffffed0;
  complex<double> *in_stack_fffffffffffffee0;
  char *msg;
  ComplexPair *in_stack_fffffffffffffef0;
  ComplexPair *this_00;
  complex<double> local_d8;
  undefined8 local_c0;
  undefined8 local_b0;
  undefined8 local_a0;
  undefined8 local_90;
  undefined8 local_80;
  undefined8 local_70;
  double local_68;
  complex<double> local_60;
  undefined8 local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  Biquad *local_10;
  
  local_10 = in_RSI;
  PoleZeroPair::PoleZeroPair(in_stack_fffffffffffffed0);
  *(undefined8 *)in_RDI[4]._M_value = 0x3ff0000000000000;
  local_18 = Biquad::getA0(local_10);
  local_20 = Biquad::getA1(local_10);
  local_28 = Biquad::getA2(local_10);
  local_30 = Biquad::getB0(local_10);
  local_38 = Biquad::getB1(local_10);
  local_40 = Biquad::getB2(local_10);
  if ((((local_28 != 0.0) || (NAN(local_28))) || (local_40 != 0.0)) || (NAN(local_40))) {
    uVar2 = 0;
    std::complex<double>::complex(&local_60,local_20 * local_20 + -(local_18 * 4.0 * local_28),0.0);
    std::sqrt<double>(in_stack_fffffffffffffee0);
    local_68 = local_18 * 2.0;
    local_48 = uVar2;
    std::operator+((double *)in_RDI,(complex<double> *)0x102aa6);
    local_90 = uVar2;
    std::operator-(in_stack_fffffffffffffee0);
    local_80 = uVar2;
    std::operator/(in_RDI,(double *)0x102aec);
    *(undefined8 *)in_RDI->_M_value = extraout_XMM0_Qa;
    *(undefined8 *)(in_RDI->_M_value + 8) = uVar2;
    local_70 = uVar2;
    std::operator-(in_RDI,(double *)0x102b2e);
    local_b0 = uVar2;
    std::operator/(in_RDI,(double *)0x102b55);
    *(undefined8 *)in_RDI[1]._M_value = extraout_XMM0_Qa_00;
    *(undefined8 *)(in_RDI[1]._M_value + 8) = uVar2;
    local_a0 = uVar2;
    bVar1 = ComplexPair::is_nan(in_stack_fffffffffffffef0);
    if (bVar1) {
      throw_invalid_argument((char *)in_stack_fffffffffffffee0);
    }
    uVar2 = 0;
    std::complex<double>::complex(&local_d8,local_38 * local_38 + -(local_30 * 4.0 * local_40),0.0);
    std::sqrt<double>(in_stack_fffffffffffffee0);
    local_c0 = uVar2;
    std::operator+((double *)in_RDI,(complex<double> *)0x102c31);
    this_00 = extraout_XMM0_Qa_01;
    std::operator-(in_stack_fffffffffffffee0);
    std::operator/(in_RDI,(double *)0x102c62);
    *(undefined8 *)in_RDI[2]._M_value = extraout_XMM0_Qa_02;
    *(undefined8 *)(in_RDI[2]._M_value + 8) = uVar2;
    std::operator-(in_RDI,(double *)0x102c96);
    std::operator/(in_RDI,(double *)0x102cb1);
    *(char **)in_RDI[3]._M_value = extraout_XMM0_Qa_03;
    *(undefined8 *)(in_RDI[3]._M_value + 8) = uVar2;
    msg = extraout_XMM0_Qa_03;
    bVar1 = ComplexPair::is_nan(this_00);
    if (bVar1) {
      throw_invalid_argument(msg);
    }
  }
  else {
    std::complex<double>::operator=(in_RDI,-local_20);
    std::complex<double>::operator=(in_RDI + 2,-local_30 / local_38);
    std::complex<double>::operator=(in_RDI + 1,0.0);
    std::complex<double>::operator=(in_RDI + 3,0.0);
  }
  *(double *)in_RDI[4]._M_value = local_30 / local_18;
  return;
}

Assistant:

BiquadPoleState::BiquadPoleState (const Biquad& s)
	{
		const double a0 = s.getA0 ();
		const double a1 = s.getA1 ();
		const double a2 = s.getA2 ();
		const double b0 = s.getB0 ();
		const double b1 = s.getB1 ();
		const double b2 = s.getB2 ();

		if (a2 == 0 && b2 == 0)
		{
			// single pole
			poles.first = -a1;
			zeros.first = -b0 / b1;
			poles.second = 0;
			zeros.second = 0;
		}
		else
		{
			{
				const complex_t c = sqrt (complex_t (a1 * a1 - 4 * a0 * a2, 0));
				double d = 2. * a0;
				poles.first = -(a1 + c) / d;
				poles.second =  (c - a1) / d;
				if (poles.is_nan()) throw_invalid_argument("poles are NaN");
			}

			{
				const complex_t c = sqrt (complex_t (
								  b1 * b1 - 4 * b0 * b2, 0));
				double d = 2. * b0;
				zeros.first = -(b1 + c) / d;
				zeros.second =  (c - b1) / d;
				if (zeros.is_nan()) throw_invalid_argument("zeros are NaN");
			}
		}

		gain = b0 / a0;
	}